

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::binary_evaluator(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   *this,XprType *xpr)

{
  scalar_difference_op<double,_double> *psVar1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *in_RSI;
  scalar_difference_op<double,_double> *in_RDI;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffa8;
  evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffffb0;
  
  evaluator_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::evaluator_base((evaluator_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)0x15223d);
  psVar1 = CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
           ::functor(in_RSI);
  scalar_difference_op<double,_double>::scalar_difference_op(in_RDI,psVar1);
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::lhs(in_RSI);
  evaluator<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::evaluator
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  psVar1 = in_RDI + 0x18;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::rhs(in_RSI);
  evaluator<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::evaluator
            ((evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)psVar1,
             in_stack_ffffffffffffffa8);
  return;
}

Assistant:

binary_evaluator(const XprType& xpr)
    : m_functor(xpr.functor()),
      m_lhsImpl(xpr.lhs()), 
      m_rhsImpl(xpr.rhs())  
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(functor_traits<BinaryOp>::Cost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }